

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O3

bool_t prf_vertex_list_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  ushort uVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  bool_t bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_vertex_list_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    bVar6 = 1;
    if (uVar2 < 5) {
      return 1;
    }
    puVar5 = node->data;
    if (puVar5 == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar5 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar5 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar7 = 4;
        goto LAB_00109f57;
      }
      uVar2 = node->length;
    }
    if (7 < uVar2) {
      iVar3 = uVar2 - 4;
      iVar9 = uVar2 - 1;
      if (-1 < iVar3) {
        iVar9 = iVar3;
      }
      bVar6 = 1;
      uVar7 = iVar9 >> 2;
      if (iVar9 >> 2 < 2) {
        uVar7 = 1;
      }
      uVar8 = 0;
      do {
        uVar4 = bf_get_uint32_be(bfile);
        *(uint32_t *)(puVar5 + uVar8 * 4) = uVar4;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  else {
    prf_error(9,"tried vertex list load method on node of type %d.",(ulong)uVar1);
    uVar7 = 2;
LAB_00109f57:
    bf_rewind(bfile,uVar7);
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

static
bool_t
prf_vertex_list_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int num, count;
    uint32_t * ptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex list load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        ptr[num] = bf_get_uint32_be( bfile );
        num++;
    }

    return TRUE;
}